

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_kv_append(unqlite *pDb,void *pKey,int nKeyLen,void *pData,unqlite_int64 nDataLen)

{
  unqlite_kv_engine *puVar1;
  _func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  iVar3 = -0x18;
  if ((pDb != (unqlite *)0x0) && (pDb->nMagic == 0xdb7c2712)) {
    puVar1 = ((pDb->sDB).pPager)->pEngine;
    UNRECOVERED_JUMPTABLE = puVar1->pIo->pMethods->xAppend;
    if (UNRECOVERED_JUMPTABLE ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      unqliteGenError(pDb,"xAppend() method not implemented in the underlying storage engine");
      iVar3 = -0x11;
    }
    else {
      if (nKeyLen < 0) {
        pcVar4 = (char *)pKey;
        if (*pKey != '\0') {
          pcVar2 = (char *)((long)pKey + 2);
          do {
            pcVar4 = pcVar2;
            if (pcVar4[-1] == '\0') {
              pcVar4 = pcVar4 + -1;
              goto LAB_0010da2f;
            }
            if (*pcVar4 == '\0') goto LAB_0010da2f;
            if (pcVar4[1] == '\0') {
              pcVar4 = pcVar4 + 1;
              goto LAB_0010da2f;
            }
            pcVar2 = pcVar4 + 4;
          } while (pcVar4[2] != '\0');
          pcVar4 = pcVar4 + 2;
        }
LAB_0010da2f:
        nKeyLen = (int)pcVar4 - (int)pKey;
      }
      if (nKeyLen != 0) {
        iVar3 = (*UNRECOVERED_JUMPTABLE)(puVar1,pKey,nKeyLen,pData,nDataLen);
        return iVar3;
      }
      unqliteGenError(pDb,"Empty key");
      iVar3 = -3;
    }
  }
  return iVar3;
}

Assistant:

int unqlite_kv_append(unqlite *pDb,const void *pKey,int nKeyLen,const void *pData,unqlite_int64 nDataLen)
{
	unqlite_kv_engine *pEngine;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 if( pEngine->pIo->pMethods->xAppend == 0 ){
		 /* Storage engine does not implement such method */
		 unqliteGenError(pDb,"xAppend() method not implemented in the underlying storage engine");
		 rc = UNQLITE_NOTIMPLEMENTED;
	 }else{
		 if( nKeyLen < 0 ){
			 /* Assume a null terminated string and compute it's length */
			 nKeyLen = SyStrlen((const char *)pKey);
		 }
		 if( !nKeyLen ){
			 unqliteGenError(pDb,"Empty key");
			 rc = UNQLITE_EMPTY;
		 }else{
			 /* Perform the requested operation */
			 rc = pEngine->pIo->pMethods->xAppend(pEngine,pKey,nKeyLen,pData,nDataLen);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}